

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O2

int archive_utility_string_sort_helper(char **strings,uint n)

{
  char *__s2;
  uint uVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  uint uVar6;
  char **strings_00;
  char **ppcVar7;
  ulong uVar8;
  uint n_00;
  uint n_01;
  char **local_48;
  
  iVar3 = 0;
  if (1 < n) {
    __s2 = *strings;
    n_00 = 0;
    local_48 = (char **)0x0;
    n_01 = 0;
    strings_00 = (char **)0x0;
    for (uVar8 = 1; n != uVar8; uVar8 = uVar8 + 1) {
      iVar3 = strcmp(strings[uVar8],__s2);
      if (iVar3 < 0) {
        ppcVar5 = (char **)realloc(strings_00,(ulong)(n_01 + 1) * 8);
        ppcVar7 = ppcVar5;
        uVar1 = n_00;
        uVar6 = n_01;
        n_01 = n_01 + 1;
        ppcVar2 = local_48;
        if (ppcVar5 == (char **)0x0) {
          free(local_48);
LAB_00586aa5:
          free(strings_00);
          return -0x1e;
        }
      }
      else {
        ppcVar5 = (char **)realloc(local_48,(ulong)(n_00 + 1) * 8);
        ppcVar7 = strings_00;
        uVar1 = n_00 + 1;
        uVar6 = n_00;
        ppcVar2 = ppcVar5;
        if (ppcVar5 == (char **)0x0) {
          free(local_48);
          goto LAB_00586aa5;
        }
      }
      local_48 = ppcVar2;
      n_00 = uVar1;
      ppcVar5[uVar6] = strings[uVar8];
      strings_00 = ppcVar7;
    }
    iVar4 = archive_utility_string_sort_helper(strings_00,n_01);
    for (uVar8 = 0; n_01 != uVar8; uVar8 = uVar8 + 1) {
      strings[uVar8] = strings_00[uVar8];
    }
    free(strings_00);
    strings[n_01] = __s2;
    iVar3 = archive_utility_string_sort_helper(local_48,n_00);
    for (uVar8 = 0; n_00 != uVar8; uVar8 = uVar8 + 1) {
      strings[n_01 + 1 + (int)uVar8] = local_48[uVar8];
    }
    free(local_48);
    if (iVar4 < iVar3) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

static int
archive_utility_string_sort_helper(char **strings, unsigned int n)
{
	unsigned int i, lesser_count, greater_count;
	char **lesser, **greater, **tmp, *pivot;
	int retval1, retval2;

	/* A list of 0 or 1 elements is already sorted */
	if (n <= 1)
		return (ARCHIVE_OK);

	lesser_count = greater_count = 0;
	lesser = greater = NULL;
	pivot = strings[0];
	for (i = 1; i < n; i++)
	{
		if (strcmp(strings[i], pivot) < 0)
		{
			lesser_count++;
			tmp = (char **)realloc(lesser,
				lesser_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			lesser = tmp;
			lesser[lesser_count - 1] = strings[i];
		}
		else
		{
			greater_count++;
			tmp = (char **)realloc(greater,
				greater_count * sizeof(char *));
			if (!tmp) {
				free(greater);
				free(lesser);
				return (ARCHIVE_FATAL);
			}
			greater = tmp;
			greater[greater_count - 1] = strings[i];
		}
	}

	/* quicksort(lesser) */
	retval1 = archive_utility_string_sort_helper(lesser, lesser_count);
	for (i = 0; i < lesser_count; i++)
		strings[i] = lesser[i];
	free(lesser);

	/* pivot */
	strings[lesser_count] = pivot;

	/* quicksort(greater) */
	retval2 = archive_utility_string_sort_helper(greater, greater_count);
	for (i = 0; i < greater_count; i++)
		strings[lesser_count + 1 + i] = greater[i];
	free(greater);

	return (retval1 < retval2) ? retval1 : retval2;
}